

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

string * backward::TraceResolverLinuxBase::get_argv0_abi_cxx11_(void)

{
  string *in_RDI;
  ifstream ifs;
  istream local_220 [520];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_220,"/proc/self/cmdline",_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,(string *)in_RDI,'\0');
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

static std::string get_argv0() {
    std::string argv0;
    std::ifstream ifs("/proc/self/cmdline");
    std::getline(ifs, argv0, '\0');
    return argv0;
  }